

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O3

int do_cmake(int ac,char **av)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  cmState *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  CacheEntryType type;
  undefined4 extraout_var;
  undefined7 uVar11;
  undefined4 extraout_var_00;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  bool in_DL;
  undefined4 uVar12;
  int iVar13;
  WorkingMode WVar14;
  pointer key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> generators;
  cmake cm;
  cmDocumentation doc;
  string local_410;
  uint local_3ec;
  WorkingMode local_3e8;
  uint local_3e4;
  char **local_3e0;
  undefined4 local_3d4;
  ulong local_3d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> local_3a8;
  undefined1 local_388 [228];
  WorkingMode local_2a4;
  cmState *local_f8;
  cmDocumentation local_d8;
  undefined8 uVar7;
  
  local_3e0 = av;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)local_388,(SystemTools *)0x1,in_DL);
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  if ((pointer)local_388._8_8_ == (pointer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Current working directory cannot be established.",0x30);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    return 1;
  }
  cmDocumentation::cmDocumentation(&local_d8);
  cmDocumentation::addCMakeStandardDocSections(&local_d8);
  bVar4 = cmDocumentation::CheckOptions(&local_d8,ac,local_3e0,(char *)0x0);
  if (bVar4) {
    cmake::cmake((cmake *)local_388);
    paVar1 = &local_410.field_2;
    local_410._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"");
    cmake::SetHomeDirectory((cmake *)local_388,&local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar1) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    local_410._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"");
    cmake::SetHomeOutputDirectory((cmake *)local_388,&local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar1) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    cmake::AddCMakePaths((cmake *)local_388);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<char_const*const*,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3c8,
               local_3e0,local_3e0 + ac,(allocator_type *)&local_410);
    cmake::SetCacheArgs((cmake *)local_388,&local_3c8);
    local_3a8.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a8.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3a8.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmake::GetGeneratorDocumentation((cmake *)local_388,&local_3a8);
    local_410._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"cmake","");
    cmDocumentation::SetName(&local_d8,&local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar1) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    cmDocumentation::SetSection(&local_d8,"Name",cmDocumentationName);
    cmDocumentation::SetSection(&local_d8,"Usage",cmDocumentationUsage);
    if (ac == 1) {
      cmDocumentation::AppendSection(&local_d8,"Usage",cmDocumentationUsageNote);
    }
    cmDocumentation::AppendSection(&local_d8,"Generators",&local_3a8);
    cmDocumentation::PrependSection(&local_d8,"Options",cmDocumentationOptions);
    bVar4 = cmDocumentation::PrintRequestedDocumentation(&local_d8,(ostream *)&std::cout);
    uVar6 = (uint)!bVar4;
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector(&local_3a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3c8);
    cmake::~cmake((cmake *)local_388);
    goto LAB_0022245d;
  }
  local_3c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ac < 1) {
    WVar14 = NORMAL_MODE;
    uVar12 = 0;
    local_3ec = 0;
    bVar4 = false;
    uVar6 = 0;
LAB_0022205a:
    cmake::cmake((cmake *)local_388);
    paVar1 = &local_410.field_2;
    local_410._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"");
    cmake::SetHomeDirectory((cmake *)local_388,&local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar1) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    local_410._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"");
    cmake::SetHomeOutputDirectory((cmake *)local_388,&local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar1) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::SetMessageCallback(cmakemainMessageCallback,local_388);
    cmake::SetProgressCallback((cmake *)local_388,cmakemainProgressCallback,(cmake *)local_388);
    local_2a4 = WVar14;
    iVar13 = cmake::Run((cmake *)local_388,&local_3c8,(bool)((byte)uVar12 & 1));
    if ((uVar6 & 1) != 0 || bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"-- Cache values",0xf);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      local_3e0 = (char **)CONCAT44(local_3e0._4_4_,iVar13);
      cmState::GetCacheEntryKeys_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_3a8,local_f8);
      if (local_3a8.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_3a8.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        key = local_3a8.
              super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
              _M_impl.super__Vector_impl_data._M_start;
        do {
          type = cmState::GetCacheEntryType(local_f8,&key->Name);
          pcVar3 = local_f8;
          if (type + ~UNINITIALIZED < 0xfffffffd) {
            local_410._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"ADVANCED","");
            pcVar8 = cmState::GetCacheEntryProperty(pcVar3,&key->Name,&local_410);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_410._M_dataplus._M_p != paVar1) {
              operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1
                             );
            }
            if (!(bool)((bVar4 ^ 1U) & pcVar8 != (char *)0x0)) {
              if ((local_3ec & 1) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"// ",3);
                pcVar3 = local_f8;
                local_410._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_410,"HELPSTRING","");
                pcVar8 = cmState::GetCacheEntryProperty(pcVar3,&key->Name,&local_410);
                if (pcVar8 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5d6768);
                }
                else {
                  sVar9 = strlen(pcVar8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pcVar8,sVar9);
                }
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
                std::ostream::put('h');
                std::ostream::flush();
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_410._M_dataplus._M_p != paVar1) {
                  operator_delete(local_410._M_dataplus._M_p,
                                  local_410.field_2._M_allocated_capacity + 1);
                }
              }
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(key->Name)._M_dataplus._M_p,
                                   (key->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
              pcVar8 = cmState::CacheEntryTypeToString(type);
              if (pcVar8 == (char *)0x0) {
                std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
              }
              else {
                sVar9 = strlen(pcVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar9);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"=",1);
              pcVar8 = cmState::GetCacheEntryValue(local_f8,&key->Name);
              if (pcVar8 == (char *)0x0) {
                std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
              }
              else {
                sVar9 = strlen(pcVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar9);
              }
              std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              if ((local_3ec & 1) != 0) {
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
                std::ostream::put('h');
                std::ostream::flush();
              }
            }
          }
          key = (pointer)&key->Brief;
        } while (key != local_3a8.
                        super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3a8);
      iVar13 = (int)local_3e0;
    }
    uVar6 = (uint)(iVar13 != 0);
  }
  else {
    iVar13 = 0;
    local_3e8 = NORMAL_MODE;
    local_3d4 = 0;
    local_3ec = 0;
    bVar4 = false;
    local_3e4 = 0;
    local_3d0 = 0;
    do {
      pcVar8 = local_3e0[iVar13];
      cVar2 = *pcVar8;
      if (cVar2 == '-') {
        if ((pcVar8[1] == 'i') && (pcVar8[2] == '\0')) {
          uVar6 = 1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "The \"cmake -i\" wizard mode is no longer supported.\nUse the -D option to set cache values on the command line.\nUse cmake-gui or ccmake for an interactive dialog.\n"
                     ,0xa1);
          goto LAB_00222453;
        }
        iVar5 = strcmp(pcVar8,"--system-information");
        uVar7 = CONCAT44(extraout_var,iVar5);
        if (iVar5 != 0) {
          uVar11 = (undefined7)((ulong)uVar7 >> 8);
          if ((pcVar8[1] == 'N') && (pcVar8[2] == '\0')) {
            local_3d4 = (undefined4)CONCAT71(uVar11,1);
          }
          else {
            if ((pcVar8[1] != 'L') || (pcVar8[2] != '\0')) goto LAB_00221d52;
            local_3e4 = (uint)CONCAT71(uVar11,1);
          }
          goto LAB_00221e67;
        }
LAB_00221dc4:
        local_3d0 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
      }
      else {
        iVar5 = strcmp(pcVar8,"--system-information");
        uVar7 = CONCAT44(extraout_var_00,iVar5);
        if (iVar5 == 0) goto LAB_00221dc4;
LAB_00221d52:
        iVar5 = strcmp(pcVar8,"-LA");
        if (iVar5 == 0) {
          bVar4 = true;
        }
        else {
          iVar5 = strcmp(pcVar8,"-LH");
          if (iVar5 == 0) {
            local_3e4 = 1;
          }
          else {
            iVar5 = strcmp(pcVar8,"-LAH");
            if (iVar5 != 0) {
              if ((cVar2 == '-') && (pcVar8[1] == 'P')) {
                if (iVar13 == ac + -1) {
                  cmSystemTools::Error
                            ("No script specified for argument -P",(char *)0x0,(char *)0x0,
                             (char *)0x0);
                  iVar13 = ac + -1;
                }
                else {
                  std::__cxx11::string::string((string *)local_388,pcVar8,(allocator *)&local_410);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_3c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_388);
                  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                  }
                  std::__cxx11::string::string
                            ((string *)local_388,local_3e0[(long)iVar13 + 1],(allocator *)&local_410
                            );
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_3c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_388);
                  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                  }
                  iVar13 = iVar13 + 1;
                  local_3e8 = SCRIPT_MODE;
                }
              }
              else {
                iVar5 = strncmp(pcVar8,"--find-package",0xe);
                if (iVar5 == 0) {
                  std::__cxx11::string::string((string *)local_388,pcVar8,(allocator *)&local_410);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_3c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_388);
                  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                  }
                  local_3e8 = FIND_PACKAGE_MODE;
                }
                else {
                  std::__cxx11::string::string((string *)local_388,pcVar8,(allocator *)&local_410);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_3c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_388);
                  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                  }
                }
              }
              goto LAB_00221e67;
            }
            bVar4 = true;
          }
          local_3ec = 1;
        }
      }
LAB_00221e67:
      iVar13 = iVar13 + 1;
    } while (iVar13 < ac);
    uVar12 = local_3d4;
    WVar14 = local_3e8;
    uVar6 = local_3e4;
    if ((local_3d0 & 1) == 0) goto LAB_0022205a;
    cmake::cmake((cmake *)local_388);
    paVar1 = &local_410.field_2;
    local_410._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"");
    cmake::SetHomeDirectory((cmake *)local_388,&local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar1) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    local_410._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"");
    cmake::SetHomeOutputDirectory((cmake *)local_388,&local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar1) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    uVar6 = cmake::GetSystemInformation((cmake *)local_388,&local_3c8);
  }
  cmake::~cmake((cmake *)local_388);
LAB_00222453:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3c8);
LAB_0022245d:
  cmDocumentation::~cmDocumentation(&local_d8);
  return uVar6;
}

Assistant:

int do_cmake(int ac, char const* const* av)
{
  if (cmSystemTools::GetCurrentWorkingDirectory().empty())
    {
    std::cerr << "Current working directory cannot be established."
              << std::endl;
    return 1;
    }

#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDocumentation doc;
  doc.addCMakeStandardDocSections();
  if(doc.CheckOptions(ac, av))
    {
    // Construct and print requested documentation.
    cmake hcm;
    hcm.SetHomeDirectory("");
    hcm.SetHomeOutputDirectory("");
    hcm.AddCMakePaths();

    // the command line args are processed here so that you can do
    // -DCMAKE_MODULE_PATH=/some/path and have this value accessible here
    std::vector<std::string> args(av, av + ac);
    hcm.SetCacheArgs(args);

    std::vector<cmDocumentationEntry> generators;

    hcm.GetGeneratorDocumentation(generators);

    doc.SetName("cmake");
    doc.SetSection("Name",cmDocumentationName);
    doc.SetSection("Usage",cmDocumentationUsage);
    if ( ac == 1 )
      {
      doc.AppendSection("Usage",cmDocumentationUsageNote);
      }
    doc.AppendSection("Generators",generators);
    doc.PrependSection("Options",cmDocumentationOptions);

    return doc.PrintRequestedDocumentation(std::cout)? 0:1;
    }
#else
  if ( ac == 1 )
    {
    std::cout <<
      "Bootstrap CMake should not be used outside CMake build process."
              << std::endl;
    return 0;
    }
#endif

  bool sysinfo = false;
  bool list_cached = false;
  bool list_all_cached = false;
  bool list_help = false;
  bool view_only = false;
  cmake::WorkingMode workingMode = cmake::NORMAL_MODE;
  std::vector<std::string> args;
  for(int i =0; i < ac; ++i)
    {
    if(strcmp(av[i], "-i") == 0)
      {
      std::cerr <<
        "The \"cmake -i\" wizard mode is no longer supported.\n"
        "Use the -D option to set cache values on the command line.\n"
        "Use cmake-gui or ccmake for an interactive dialog.\n";
      return 1;
      }
    else if(strcmp(av[i], "--system-information") == 0)
      {
      sysinfo = true;
      }
    else if (strcmp(av[i], "-N") == 0)
      {
      view_only = true;
      }
    else if (strcmp(av[i], "-L") == 0)
      {
      list_cached = true;
      }
    else if (strcmp(av[i], "-LA") == 0)
      {
      list_all_cached = true;
      }
    else if (strcmp(av[i], "-LH") == 0)
      {
      list_cached = true;
      list_help = true;
      }
    else if (strcmp(av[i], "-LAH") == 0)
      {
      list_all_cached = true;
      list_help = true;
      }
    else if (cmHasLiteralPrefix(av[i], "-P"))
      {
      if ( i == ac -1 )
        {
        cmSystemTools::Error("No script specified for argument -P");
        }
      else
        {
        workingMode = cmake::SCRIPT_MODE;
        args.push_back(av[i]);
        i++;
        args.push_back(av[i]);
        }
      }
    else if (cmHasLiteralPrefix(av[i], "--find-package"))
      {
      workingMode = cmake::FIND_PACKAGE_MODE;
      args.push_back(av[i]);
      }
    else
      {
      args.push_back(av[i]);
      }
    }
  if (sysinfo)
    {
    cmake cm;
    cm.SetHomeDirectory("");
    cm.SetHomeOutputDirectory("");
    int ret = cm.GetSystemInformation(args);
    return ret;
    }
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cmSystemTools::SetMessageCallback(cmakemainMessageCallback, (void *)&cm);
  cm.SetProgressCallback(cmakemainProgressCallback, (void *)&cm);
  cm.SetWorkingMode(workingMode);

  int res = cm.Run(args, view_only);
  if ( list_cached || list_all_cached )
    {
    std::cout << "-- Cache values" << std::endl;
    std::vector<std::string> keys = cm.GetState()->GetCacheEntryKeys();
    for (std::vector<std::string>::const_iterator it = keys.begin();
        it != keys.end(); ++it)
      {
      cmState::CacheEntryType t = cm.GetState()->GetCacheEntryType(*it);
      if (t != cmState::INTERNAL && t != cmState::STATIC &&
          t != cmState::UNINITIALIZED)
        {
        const char* advancedProp =
            cm.GetState()->GetCacheEntryProperty(*it, "ADVANCED");
        if ( list_all_cached || !advancedProp)
          {
          if ( list_help )
            {
            std::cout << "// "
                      << cm.GetState()->GetCacheEntryProperty(*it,
                                                   "HELPSTRING") << std::endl;
            }
          std::cout << *it << ":" <<
            cmState::CacheEntryTypeToString(t)
            << "=" << cm.GetState()->GetCacheEntryValue(*it)
            << std::endl;
          if ( list_help )
            {
            std::cout << std::endl;
            }
          }
        }
      }
    }

  // Always return a non-negative value.  Windows tools do not always
  // interpret negative return values as errors.
  if(res != 0)
    {
    return 1;
    }
  else
    {
    return 0;
    }
}